

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WindowCodeStep(Parse *pParse,Select *p,WhereInfo *pWInfo,int regGosub,int addrGosub)

{
  u8 uVar1;
  short sVar2;
  int iVar3;
  Window *pWVar4;
  ExprList *pEVar5;
  FuncDef *pFVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Vdbe *p_00;
  KeyInfo *p4;
  Vdbe *p_01;
  Op *pOVar13;
  int target;
  Window *pWVar14;
  int target_00;
  int p1;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  WindowCodeArg s;
  long local_d8;
  int local_cc;
  int local_c0;
  long local_b0;
  WindowCodeArg local_98;
  int local_4c;
  int local_48;
  int local_44;
  ExprList *local_40;
  WhereInfo *local_38;
  
  pWVar4 = p->pWin;
  local_40 = pWVar4->pOrderBy;
  local_38 = pWInfo;
  p_00 = sqlite3GetVdbe(pParse);
  iVar17 = p->pSrc->a[0].iCursor;
  sVar2 = (p->pSrc->a[0].pTab)->nCol;
  iVar16 = (int)sVar2;
  local_44 = pParse->nLabel + -1;
  pParse->nLabel = local_44;
  local_98.regArg = 0;
  local_98.eDelete = 0;
  local_98.end.reg = 0;
  local_98._68_4_ = 0;
  local_98.regGosub = regGosub;
  local_98.addrGosub = addrGosub;
  iVar12 = pWVar4->iEphCsr;
  local_98.start.reg = 0;
  local_48 = iVar12 + 2;
  local_98.regRowid = 0;
  iVar8 = iVar12 + 3;
  local_98.current.reg = 0;
  local_98.pParse = pParse;
  local_98.pMWin = pWVar4;
  local_98.pVdbe = p_00;
  local_98.start.csr = local_48;
  local_98.current.csr = iVar12;
  local_98.end.csr = iVar8;
  if (pWVar4->eStart == 'Z') {
    pWVar14 = pWVar4;
    if (pWVar4->regStartRowid == 0) {
      for (; pWVar14 != (Window *)0x0; pWVar14 = pWVar14->pNextWin) {
        pcVar7 = pWVar14->pWFunc->zName;
        if ((((pcVar7 == "lag") || (pcVar7 == "lead")) || (pcVar7 == "nth_value")) ||
           (pcVar7 == "first_value")) goto LAB_0017fe4a;
      }
      iVar10 = 1;
      if (pWVar4->eEnd != 'X') goto LAB_0017fe46;
      if (pWVar4->eFrmType != 'Y') {
        iVar9 = windowExprGtZero(pParse,pWVar4->pEnd);
        iVar10 = 3;
        goto LAB_0017fdbb;
      }
    }
  }
  else {
    iVar10 = 2;
    if (pWVar4->eStart == 'V') {
      if (pWVar4->eFrmType != 'Y') {
        iVar9 = windowExprGtZero(pParse,pWVar4->pStart);
        iVar10 = 1;
LAB_0017fdbb:
        if (iVar9 != 0) goto LAB_0017fe46;
      }
    }
    else {
LAB_0017fe46:
      local_98.eDelete = iVar10;
    }
  }
LAB_0017fe4a:
  iVar10 = pParse->nMem;
  iVar9 = iVar10 + iVar16 + 2;
  pParse->nMem = iVar9;
  local_98.regRowid = iVar9;
  if ((pWVar4->eStart == 'X') || (target = 0, pWVar4->eStart == 'V')) {
    target = iVar10 + iVar16 + 3;
    pParse->nMem = target;
  }
  if ((pWVar4->eEnd == 'X') || (target_00 = 0, pWVar4->eEnd == 'V')) {
    target_00 = pParse->nMem + 1;
    pParse->nMem = target_00;
  }
  iVar15 = iVar10 + 1;
  local_cc = 0;
  p1 = 0;
  if (pWVar4->eFrmType != 'L') {
    if (local_40 == (ExprList *)0x0) {
      iVar18 = 0;
    }
    else {
      iVar18 = local_40->nExpr;
    }
    p1 = pWVar4->nBufferCol + iVar15;
    if (pWVar4->pPartition != (ExprList *)0x0) {
      p1 = p1 + pWVar4->pPartition->nExpr;
    }
    iVar11 = pParse->nMem;
    local_cc = iVar11 + 1;
    local_98.current.reg = iVar11 + iVar18;
    pParse->nMem = local_98.current.reg;
    local_98.start.reg = iVar11 + 1 + iVar18;
    iVar11 = local_98.current.reg + iVar18;
    pParse->nMem = iVar11;
    local_98.current.reg = iVar18 + 1 + local_98.current.reg;
    pParse->nMem = iVar11 + iVar18;
    local_98.end.reg = iVar11 + iVar18 + 1;
    pParse->nMem = iVar11 + iVar18 + iVar18;
  }
  iVar10 = iVar10 + iVar16 + 1;
  if (0 < sVar2) {
    iVar18 = 0;
    do {
      sqlite3VdbeAddOp3(p_00,0x5e,iVar17,iVar18,iVar15 + iVar18);
      iVar18 = iVar18 + 1;
    } while (iVar16 != iVar18);
  }
  iVar18 = iVar12 + 1;
  sqlite3VdbeAddOp3(p_00,0x61,iVar15,iVar16,iVar10);
  pEVar5 = pWVar4->pPartition;
  iVar17 = 0;
  if (pEVar5 == (ExprList *)0x0) {
    local_c0 = 0;
    local_b0 = 0;
  }
  else {
    iVar16 = pEVar5->nExpr;
    iVar15 = iVar15 + pWVar4->nBufferCol;
    p4 = sqlite3KeyInfoFromExprList(pParse,pEVar5,0,0);
    local_c0 = pParse->nMem + 1;
    pParse->nMem = local_c0;
    iVar11 = sqlite3VdbeAddOp3(p_00,0x5a,iVar15,pWVar4->regPart,iVar16);
    if (p_00->db->mallocFailed == '\0') {
      pOVar13 = p_00->aOp;
      iVar3 = p_00->nOp;
      pOVar13[(long)iVar3 + -1].p4type = -8;
      pOVar13[(long)iVar3 + -1].p4.pKeyInfo = p4;
    }
    else {
      freeP4(p_00->db,-8,p4);
    }
    sqlite3VdbeAddOp3(p_00,0xe,iVar11 + 2,iVar11 + 4,iVar11 + 2);
    iVar11 = sqlite3VdbeAddOp3(p_00,10,local_c0,0,0);
    sqlite3VdbeAddOp3(p_00,0x50,iVar15,pWVar4->regPart,iVar16 + -1);
    local_b0 = (long)iVar11;
  }
  sqlite3VdbeAddOp3(p_00,0x7f,iVar18,iVar9,0);
  sqlite3VdbeAddOp3(p_00,0x80,iVar18,iVar10,iVar9);
  iVar16 = sqlite3VdbeAddOp3(p_00,0x34,pWVar4->regOne,0,iVar9);
  p_01 = sqlite3GetVdbe(pParse);
  if (pWVar4 != (Window *)0x0) {
    pWVar14 = pWVar4;
    iVar10 = 0;
    do {
      pFVar6 = pWVar14->pWFunc;
      sqlite3VdbeAddOp3(p_01,0x4b,0,pWVar14->regAccum,0);
      pEVar5 = (pWVar14->pOwner->x).pList;
      iVar9 = 0;
      if (pEVar5 != (ExprList *)0x0) {
        iVar9 = pEVar5->nExpr;
      }
      iVar17 = 0;
      if (iVar9 < iVar10) {
        iVar17 = iVar10;
      }
      if ((pEVar5 != (ExprList *)0x0) && (iVar10 <= iVar9)) {
        iVar17 = pEVar5->nExpr;
      }
      if (pWVar4->regStartRowid == 0) {
        pcVar7 = pFVar6->zName;
        if (pcVar7 == "nth_value" || pcVar7 == "first_value") {
          sqlite3VdbeAddOp3(p_01,0x47,0,pWVar14->regApp,0);
          sqlite3VdbeAddOp3(p_01,0x47,0,pWVar14->regApp + 1,0);
        }
        if (((pFVar6->funcFlags & 0x1000) != 0) && (pWVar14->csrApp != 0)) {
          sqlite3VdbeAddOp3(p_01,0x92,pWVar14->csrApp,0,0);
          sqlite3VdbeAddOp3(p_01,0x47,0,pWVar14->regApp + 1,0);
        }
      }
      pWVar14 = pWVar14->pNextWin;
      iVar10 = iVar17;
    } while (pWVar14 != (Window *)0x0);
  }
  iVar10 = pParse->nMem;
  pParse->nMem = iVar17 + iVar10;
  local_98.regArg = iVar10 + 1;
  if (target != 0) {
    sqlite3ExprCode(pParse,pWVar4->pStart,target);
    windowCheckValue(pParse,target,(uint)(pWVar4->eFrmType == 'Y') * 3);
  }
  iVar17 = local_44;
  if (target_00 != 0) {
    sqlite3ExprCode(pParse,pWVar4->pEnd,target_00);
    windowCheckValue(pParse,target_00,(uint)(pWVar4->eFrmType == 'Y') * 3 + 1);
  }
  if (((pWVar4->eFrmType != 'Y') && (target != 0)) && (pWVar4->eStart == pWVar4->eEnd)) {
    local_4c = sqlite3VdbeAddOp3(p_00,(uint)(pWVar4->eStart == 'V') * 2 + 0x37,target,0,target_00);
    windowAggFinal(&local_98,0);
    sqlite3VdbeAddOp3(p_00,0x24,iVar12,0,0);
    windowReturnOneRow(&local_98);
    sqlite3VdbeAddOp3(p_00,0x92,iVar12,0,0);
    sqlite3VdbeAddOp3(p_00,9,0,iVar17,0);
    if (p_00->db->mallocFailed == '\0') {
      pOVar13 = p_00->aOp + local_4c;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->p2 = p_00->nOp;
  }
  if (((pWVar4->eStart == 'V') && (target_00 != 0)) && (pWVar4->eFrmType != 'Y')) {
    sqlite3VdbeAddOp3(p_00,0x6b,target,target_00,target);
  }
  pEVar5 = local_40;
  if (pWVar4->eStart != 'Z') {
    sqlite3VdbeAddOp3(p_00,0x24,local_48,0,0);
  }
  sqlite3VdbeAddOp3(p_00,0x24,iVar12,0,0);
  sqlite3VdbeAddOp3(p_00,0x24,iVar8,0,0);
  if (pEVar5 != (ExprList *)0x0 && local_cc != 0) {
    sqlite3VdbeAddOp3(p_00,0x50,p1,local_cc,pEVar5->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x50,local_cc,local_98.start.reg,pEVar5->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x50,local_cc,local_98.current.reg,pEVar5->nExpr + -1);
    sqlite3VdbeAddOp3(p_00,0x50,local_cc,local_98.end.reg,pEVar5->nExpr + -1);
  }
  sqlite3VdbeAddOp3(p_00,9,0,iVar17,0);
  if (p_00->db->mallocFailed == '\0') {
    pOVar13 = p_00->aOp + iVar16;
  }
  else {
    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar13->p2 = p_00->nOp;
  if (local_cc != 0) {
    windowIfNewPeer(pParse,pEVar5,p1,local_cc,iVar17);
  }
  if (pWVar4->eStart == 'V') {
    windowCodeOp(&local_98,3,0,0);
    if (pWVar4->eEnd != 'Z') {
      iVar16 = target_00;
      if (pWVar4->eFrmType != 'Y') {
LAB_00180664:
        windowCodeOp(&local_98,1,iVar16,0);
        iVar8 = 2;
        iVar12 = target;
        goto LAB_00180676;
      }
      iVar10 = pParse->nLabel + -1;
      pParse->nLabel = iVar10;
      iVar16 = p_00->nOp;
      windowCodeRangeTest(&local_98,0x39,iVar12,target_00,iVar8,iVar10);
      windowCodeOp(&local_98,2,target,0);
      windowCodeOp(&local_98,1,0,0);
LAB_001806f7:
      sqlite3VdbeAddOp3(p_00,9,0,iVar16,0);
      sqlite3VdbeResolveLabel(p_00,iVar10);
    }
  }
  else {
    if (pWVar4->eEnd != 'X') {
      windowCodeOp(&local_98,3,0,0);
      if (pWVar4->eEnd != 'Z') {
        if (pWVar4->eFrmType == 'Y') {
          iVar16 = p_00->nOp;
          if (target_00 == 0) {
            iVar10 = 0;
          }
          else {
            iVar10 = pParse->nLabel + -1;
            pParse->nLabel = iVar10;
            windowCodeRangeTest(&local_98,0x39,iVar12,target_00,iVar8,iVar10);
          }
          windowCodeOp(&local_98,1,0,0);
          windowCodeOp(&local_98,2,target,0);
          if (target_00 != 0) goto LAB_001806f7;
        }
        else {
          if (target_00 == 0) {
            local_d8 = 0;
          }
          else {
            iVar12 = sqlite3VdbeAddOp3(p_00,0x3b,target_00,0,1);
            local_d8 = (long)iVar12;
          }
          windowCodeOp(&local_98,1,0,0);
          windowCodeOp(&local_98,2,target,0);
          if (target_00 != 0) {
            if (p_00->db->mallocFailed == '\0') {
              pOVar13 = p_00->aOp + local_d8;
            }
            else {
              pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar13->p2 = p_00->nOp;
          }
        }
      }
      goto LAB_0018070a;
    }
    if (pWVar4->eStart != 'X') {
      windowCodeOp(&local_98,3,target_00,0);
LAB_00180655:
      iVar16 = 0;
      goto LAB_00180664;
    }
    uVar1 = pWVar4->eFrmType;
    windowCodeOp(&local_98,3,target_00,0);
    if (uVar1 != 'Y') goto LAB_00180655;
    windowCodeOp(&local_98,2,target,0);
    iVar8 = 1;
    iVar12 = 0;
LAB_00180676:
    windowCodeOp(&local_98,iVar8,iVar12,0);
  }
LAB_0018070a:
  sqlite3VdbeResolveLabel(p_00,iVar17);
  sqlite3WhereEnd(local_38);
  if (pWVar4->pPartition == (ExprList *)0x0) {
    lVar19 = 0;
  }
  else {
    iVar17 = sqlite3VdbeAddOp3(p_00,0x47,0,local_c0,0);
    if (p_00->db->mallocFailed == '\0') {
      pOVar13 = p_00->aOp + local_b0;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->p2 = p_00->nOp;
    lVar19 = (long)iVar17;
  }
  local_98._40_8_ = local_98._40_8_ & 0xffffffff00000000;
  iVar17 = sqlite3VdbeAddOp3(p_00,0x24,iVar18,0,0);
  uVar1 = pWVar4->eStart;
  if (pWVar4->eEnd != 'X') {
    windowCodeOp(&local_98,3,0,0);
    if (uVar1 == 'V') {
      if (pWVar4->eFrmType == 'Y') {
        iVar12 = p_00->nOp;
        iVar16 = windowCodeOp(&local_98,2,target,1);
        iVar8 = windowCodeOp(&local_98,1,0,1);
      }
      else {
        iVar12 = p_00->nOp;
        if (pWVar4->eEnd == 'Z') {
          iVar8 = windowCodeOp(&local_98,1,target,1);
          target = 0;
        }
        else {
          iVar8 = windowCodeOp(&local_98,1,target_00,1);
        }
        iVar16 = windowCodeOp(&local_98,2,target,1);
      }
      sqlite3VdbeAddOp3(p_00,9,0,iVar12,0);
      iVar12 = p_00->nOp;
      if (p_00->db->mallocFailed == '\0') {
        pOVar13 = p_00->aOp + iVar16;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = iVar12;
      iVar16 = windowCodeOp(&local_98,1,0,1);
      sqlite3VdbeAddOp3(p_00,9,0,iVar12,0);
      iVar12 = p_00->nOp;
      if (p_00->db->mallocFailed == '\0') {
        pOVar13 = p_00->aOp;
        pOVar13[iVar8].p2 = iVar12;
        pOVar13 = pOVar13 + iVar16;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
        DAT_001e99e8 = iVar12;
      }
      pOVar13->p2 = iVar12;
    }
    else {
      iVar12 = p_00->nOp;
      iVar8 = windowCodeOp(&local_98,1,0,1);
      windowCodeOp(&local_98,2,target,0);
      sqlite3VdbeAddOp3(p_00,9,0,iVar12,0);
      if (p_00->db->mallocFailed == '\0') {
        pOVar13 = p_00->aOp + iVar8;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = p_00->nOp;
    }
    goto LAB_00180a38;
  }
  if (uVar1 == 'X') {
    uVar1 = pWVar4->eFrmType;
    windowCodeOp(&local_98,3,target_00,0);
    if (uVar1 == 'Y') {
      iVar12 = 2;
      target_00 = target;
      goto LAB_0018086c;
    }
  }
  else {
    iVar12 = 3;
LAB_0018086c:
    windowCodeOp(&local_98,iVar12,target_00,0);
  }
  windowCodeOp(&local_98,1,0,0);
LAB_00180a38:
  if (p_00->db->mallocFailed == '\0') {
    pOVar13 = p_00->aOp + iVar17;
  }
  else {
    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar13->p2 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x92,local_98.current.csr,0,0);
  if (pWVar4->pPartition == (ExprList *)0x0) {
    return;
  }
  if (pWVar4->regStartRowid != 0) {
    sqlite3VdbeAddOp3(p_00,0x47,1,pWVar4->regStartRowid,0);
    sqlite3VdbeAddOp3(p_00,0x47,0,pWVar4->regEndRowid,0);
  }
  if (p_00->db->mallocFailed == '\0') {
    pOVar13 = p_00->aOp + lVar19;
  }
  else {
    pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar13->p1 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,0x43,local_c0,0,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowCodeStep(
  Parse *pParse,                  /* Parse context */
  Select *p,                      /* Rewritten SELECT statement */
  WhereInfo *pWInfo,              /* Context returned by sqlite3WhereBegin() */
  int regGosub,                   /* Register for OP_Gosub */
  int addrGosub                   /* OP_Gosub here to return each row */
){
  Window *pMWin = p->pWin;
  ExprList *pOrderBy = pMWin->pOrderBy;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int csrWrite;                   /* Cursor used to write to eph. table */
  int csrInput = p->pSrc->a[0].iCursor;     /* Cursor of sub-select */
  int nInput = p->pSrc->a[0].pTab->nCol;    /* Number of cols returned by sub */
  int iInput;                               /* To iterate through sub cols */
  int addrNe;                     /* Address of OP_Ne */
  int addrGosubFlush = 0;         /* Address of OP_Gosub to flush: */
  int addrInteger = 0;            /* Address of OP_Integer */
  int addrEmpty;                  /* Address of OP_Rewind in flush: */
  int regNew;                     /* Array of registers holding new input row */
  int regRecord;                  /* regNew array in record form */
  int regNewPeer = 0;             /* Peer values for new row (part of regNew) */
  int regPeer = 0;                /* Peer values for current row */
  int regFlushPart = 0;           /* Register for "Gosub flush_partition" */
  WindowCodeArg s;                /* Context object for sub-routines */
  int lblWhereEnd;                /* Label just before sqlite3WhereEnd() code */
  int regStart = 0;               /* Value of <expr> PRECEDING */
  int regEnd = 0;                 /* Value of <expr> FOLLOWING */

  assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_CURRENT
       || pMWin->eStart==TK_FOLLOWING || pMWin->eStart==TK_UNBOUNDED
  );
  assert( pMWin->eEnd==TK_FOLLOWING || pMWin->eEnd==TK_CURRENT
       || pMWin->eEnd==TK_UNBOUNDED || pMWin->eEnd==TK_PRECEDING
  );
  assert( pMWin->eExclude==0 || pMWin->eExclude==TK_CURRENT
       || pMWin->eExclude==TK_GROUP || pMWin->eExclude==TK_TIES
       || pMWin->eExclude==TK_NO
  );

  lblWhereEnd = sqlite3VdbeMakeLabel(pParse);

  /* Fill in the context object */
  memset(&s, 0, sizeof(WindowCodeArg));
  s.pParse = pParse;
  s.pMWin = pMWin;
  s.pVdbe = v;
  s.regGosub = regGosub;
  s.addrGosub = addrGosub;
  s.current.csr = pMWin->iEphCsr;
  csrWrite = s.current.csr+1;
  s.start.csr = s.current.csr+2;
  s.end.csr = s.current.csr+3;

  /* Figure out when rows may be deleted from the ephemeral table. There
  ** are four options - they may never be deleted (eDelete==0), they may
  ** be deleted as soon as they are no longer part of the window frame
  ** (eDelete==WINDOW_AGGINVERSE), they may be deleted as after the row
  ** has been returned to the caller (WINDOW_RETURN_ROW), or they may
  ** be deleted after they enter the frame (WINDOW_AGGSTEP). */
  switch( pMWin->eStart ){
    case TK_FOLLOWING:
      if( pMWin->eFrmType!=TK_RANGE
       && windowExprGtZero(pParse, pMWin->pStart)
      ){
        s.eDelete = WINDOW_RETURN_ROW;
      }
      break;
    case TK_UNBOUNDED:
      if( windowCacheFrame(pMWin)==0 ){
        if( pMWin->eEnd==TK_PRECEDING ){
          if( pMWin->eFrmType!=TK_RANGE
           && windowExprGtZero(pParse, pMWin->pEnd)
          ){
            s.eDelete = WINDOW_AGGSTEP;
          }
        }else{
          s.eDelete = WINDOW_RETURN_ROW;
        }
      }
      break;
    default:
      s.eDelete = WINDOW_AGGINVERSE;
      break;
  }

  /* Allocate registers for the array of values from the sub-query, the
  ** same values in record form, and the rowid used to insert said record
  ** into the ephemeral table.  */
  regNew = pParse->nMem+1;
  pParse->nMem += nInput;
  regRecord = ++pParse->nMem;
  s.regRowid = ++pParse->nMem;

  /* If the window frame contains an "<expr> PRECEDING" or "<expr> FOLLOWING"
  ** clause, allocate registers to store the results of evaluating each
  ** <expr>.  */
  if( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING ){
    regStart = ++pParse->nMem;
  }
  if( pMWin->eEnd==TK_PRECEDING || pMWin->eEnd==TK_FOLLOWING ){
    regEnd = ++pParse->nMem;
  }

  /* If this is not a "ROWS BETWEEN ..." frame, then allocate arrays of
  ** registers to store copies of the ORDER BY expressions (peer values)
  ** for the main loop, and for each cursor (start, current and end). */
  if( pMWin->eFrmType!=TK_ROWS ){
    int nPeer = (pOrderBy ? pOrderBy->nExpr : 0);
    regNewPeer = regNew + pMWin->nBufferCol;
    if( pMWin->pPartition ) regNewPeer += pMWin->pPartition->nExpr;
    regPeer = pParse->nMem+1;       pParse->nMem += nPeer;
    s.start.reg = pParse->nMem+1;   pParse->nMem += nPeer;
    s.current.reg = pParse->nMem+1; pParse->nMem += nPeer;
    s.end.reg = pParse->nMem+1;     pParse->nMem += nPeer;
  }

  /* Load the column values for the row returned by the sub-select
  ** into an array of registers starting at regNew. Assemble them into
  ** a record in register regRecord. */
  for(iInput=0; iInput<nInput; iInput++){
    sqlite3VdbeAddOp3(v, OP_Column, csrInput, iInput, regNew+iInput);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regNew, nInput, regRecord);

  /* An input row has just been read into an array of registers starting
  ** at regNew. If the window has a PARTITION clause, this block generates
  ** VM code to check if the input row is the start of a new partition.
  ** If so, it does an OP_Gosub to an address to be filled in later. The
  ** address of the OP_Gosub is stored in local variable addrGosubFlush. */
  if( pMWin->pPartition ){
    int addr;
    ExprList *pPart = pMWin->pPartition;
    int nPart = pPart->nExpr;
    int regNewPart = regNew + pMWin->nBufferCol;
    KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pPart, 0, 0);

    regFlushPart = ++pParse->nMem;
    addr = sqlite3VdbeAddOp3(v, OP_Compare, regNewPart, pMWin->regPart, nPart);
    sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
    sqlite3VdbeAddOp3(v, OP_Jump, addr+2, addr+4, addr+2);
    VdbeCoverageEqNe(v);
    addrGosubFlush = sqlite3VdbeAddOp1(v, OP_Gosub, regFlushPart);
    VdbeComment((v, "call flush_partition"));
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPart, pMWin->regPart, nPart-1);
  }

  /* Insert the new row into the ephemeral table */
  sqlite3VdbeAddOp2(v, OP_NewRowid, csrWrite, s.regRowid);
  sqlite3VdbeAddOp3(v, OP_Insert, csrWrite, regRecord, s.regRowid);
  addrNe = sqlite3VdbeAddOp3(v, OP_Ne, pMWin->regOne, 0, s.regRowid);
  VdbeCoverageNeverNull(v);

  /* This block is run for the first row of each partition */
  s.regArg = windowInitAccum(pParse, pMWin);

  if( regStart ){
    sqlite3ExprCode(pParse, pMWin->pStart, regStart);
    windowCheckValue(pParse, regStart, 0 + (pMWin->eFrmType==TK_RANGE?3:0));
  }
  if( regEnd ){
    sqlite3ExprCode(pParse, pMWin->pEnd, regEnd);
    windowCheckValue(pParse, regEnd, 1 + (pMWin->eFrmType==TK_RANGE?3:0));
  }

  if( pMWin->eFrmType!=TK_RANGE && pMWin->eStart==pMWin->eEnd && regStart ){
    int op = ((pMWin->eStart==TK_FOLLOWING) ? OP_Ge : OP_Le);
    int addrGe = sqlite3VdbeAddOp3(v, op, regStart, 0, regEnd);
    VdbeCoverageNeverNullIf(v, op==OP_Ge); /* NeverNull because bound <expr> */
    VdbeCoverageNeverNullIf(v, op==OP_Le); /*   values previously checked */
    windowAggFinal(&s, 0);
    sqlite3VdbeAddOp1(v, OP_Rewind, s.current.csr);
    windowReturnOneRow(&s);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);
    sqlite3VdbeJumpHere(v, addrGe);
  }
  if( pMWin->eStart==TK_FOLLOWING && pMWin->eFrmType!=TK_RANGE && regEnd ){
    assert( pMWin->eEnd==TK_FOLLOWING );
    sqlite3VdbeAddOp3(v, OP_Subtract, regStart, regEnd, regStart);
  }

  if( pMWin->eStart!=TK_UNBOUNDED ){
    sqlite3VdbeAddOp1(v, OP_Rewind, s.start.csr);
  }
  sqlite3VdbeAddOp1(v, OP_Rewind, s.current.csr);
  sqlite3VdbeAddOp1(v, OP_Rewind, s.end.csr);
  if( regPeer && pOrderBy ){
    sqlite3VdbeAddOp3(v, OP_Copy, regNewPeer, regPeer, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.start.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.current.reg, pOrderBy->nExpr-1);
    sqlite3VdbeAddOp3(v, OP_Copy, regPeer, s.end.reg, pOrderBy->nExpr-1);
  }

  sqlite3VdbeAddOp2(v, OP_Goto, 0, lblWhereEnd);

  sqlite3VdbeJumpHere(v, addrNe);

  /* Beginning of the block executed for the second and subsequent rows. */
  if( regPeer ){
    windowIfNewPeer(pParse, pOrderBy, regNewPeer, regPeer, lblWhereEnd);
  }
  if( pMWin->eStart==TK_FOLLOWING ){
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = sqlite3VdbeMakeLabel(pParse);
        int addrNext = sqlite3VdbeCurrentAddr(v);
        windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNext);
        sqlite3VdbeResolveLabel(v, lbl);
      }else{
        windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
      }
    }
  }else
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
    if( !bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
  }else{
    int addr = 0;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eEnd!=TK_UNBOUNDED ){
      if( pMWin->eFrmType==TK_RANGE ){
        int lbl = 0;
        addr = sqlite3VdbeCurrentAddr(v);
        if( regEnd ){
          lbl = sqlite3VdbeMakeLabel(pParse);
          windowCodeRangeTest(&s, OP_Ge, s.current.csr, regEnd, s.end.csr, lbl);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ){
          sqlite3VdbeAddOp2(v, OP_Goto, 0, addr);
          sqlite3VdbeResolveLabel(v, lbl);
        }
      }else{
        if( regEnd ){
          addr = sqlite3VdbeAddOp3(v, OP_IfPos, regEnd, 0, 1);
          VdbeCoverage(v);
        }
        windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
        windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
        if( regEnd ) sqlite3VdbeJumpHere(v, addr);
      }
    }
  }

  /* End of the main input loop */
  sqlite3VdbeResolveLabel(v, lblWhereEnd);
  sqlite3WhereEnd(pWInfo);

  /* Fall through */
  if( pMWin->pPartition ){
    addrInteger = sqlite3VdbeAddOp2(v, OP_Integer, 0, regFlushPart);
    sqlite3VdbeJumpHere(v, addrGosubFlush);
  }

  s.regRowid = 0;
  addrEmpty = sqlite3VdbeAddOp1(v, OP_Rewind, csrWrite);
  VdbeCoverage(v);
  if( pMWin->eEnd==TK_PRECEDING ){
    int bRPS = (pMWin->eStart==TK_PRECEDING && pMWin->eFrmType==TK_RANGE);
    windowCodeOp(&s, WINDOW_AGGSTEP, regEnd, 0);
    if( bRPS ) windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 0);
  }else if( pMWin->eStart==TK_FOLLOWING ){
    int addrStart;
    int addrBreak1;
    int addrBreak2;
    int addrBreak3;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    if( pMWin->eFrmType==TK_RANGE ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    }else
    if( pMWin->eEnd==TK_UNBOUNDED ){
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regStart, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, 0, 1);
    }else{
      assert( pMWin->eEnd==TK_FOLLOWING );
      addrStart = sqlite3VdbeCurrentAddr(v);
      addrBreak1 = windowCodeOp(&s, WINDOW_RETURN_ROW, regEnd, 1);
      addrBreak2 = windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 1);
    }
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak2);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak3 = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak1);
    sqlite3VdbeJumpHere(v, addrBreak3);
  }else{
    int addrBreak;
    int addrStart;
    windowCodeOp(&s, WINDOW_AGGSTEP, 0, 0);
    addrStart = sqlite3VdbeCurrentAddr(v);
    addrBreak = windowCodeOp(&s, WINDOW_RETURN_ROW, 0, 1);
    windowCodeOp(&s, WINDOW_AGGINVERSE, regStart, 0);
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrStart);
    sqlite3VdbeJumpHere(v, addrBreak);
  }
  sqlite3VdbeJumpHere(v, addrEmpty);

  sqlite3VdbeAddOp1(v, OP_ResetSorter, s.current.csr);
  if( pMWin->pPartition ){
    if( pMWin->regStartRowid ){
      sqlite3VdbeAddOp2(v, OP_Integer, 1, pMWin->regStartRowid);
      sqlite3VdbeAddOp2(v, OP_Integer, 0, pMWin->regEndRowid);
    }
    sqlite3VdbeChangeP1(v, addrInteger, sqlite3VdbeCurrentAddr(v));
    sqlite3VdbeAddOp1(v, OP_Return, regFlushPart);
  }
}